

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void tlstran_ep_connect(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err nStack_20;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  if (*(char *)((long)arg + 0x39) == '\x01') {
    nni_mtx_unlock((nni_mtx *)arg);
    nStack_20 = NNG_ECLOSED;
  }
  else {
    if (*(long *)((long)arg + 0x78) == 0) {
      _Var1 = nni_aio_start(aio,tlstran_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 0x78) = aio;
        nng_stream_dialer_dial
                  (*(nng_stream_dialer **)((long)arg + 0x58),(nng_aio *)((long)arg + 0x80));
      }
      nni_mtx_unlock((nni_mtx *)arg);
      return;
    }
    nni_mtx_unlock((nni_mtx *)arg);
    nStack_20 = NNG_EBUSY;
  }
  nni_aio_finish_error(aio,nStack_20);
  return;
}

Assistant:

static void
tlstran_ep_connect(void *arg, nni_aio *aio)
{
	tlstran_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (ep->useraio != NULL) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_EBUSY);
		return;
	}
	if (!nni_aio_start(aio, tlstran_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->useraio = aio;

	nng_stream_dialer_dial(ep->dialer, &ep->connaio);
	nni_mtx_unlock(&ep->mtx);
}